

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_semacheck2.c
# Opt level: O1

_Bool gravity_semacheck2(gnode_t *node,gravity_delegate_t *delegate)

{
  gnode_r *local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  void *pvStack_100;
  undefined8 local_f8;
  gvisitor_t local_f0;
  
  local_108 = 0;
  pvStack_100 = (void *)0x0;
  local_118 = (gnode_r *)0x0;
  uStack_110 = 0;
  local_f8 = 0;
  local_118 = gnode_array_create();
  uStack_110 = 0;
  local_108 = 0;
  pvStack_100 = (void *)0x0;
  local_f0.nerr = 0;
  local_f0.bflag = false;
  local_f0.visit_pre = (_func_void_gvisitor_ptr_gnode_t_ptr *)0x0;
  local_f0.visit_post = (_func_void_gvisitor_ptr_gnode_t_ptr *)0x0;
  local_f0.visit_list_stmt = visit_list_stmt;
  local_f0.visit_compound_stmt = visit_compound_stmt;
  local_f0.visit_label_stmt = visit_label_stmt;
  local_f0.visit_flow_stmt = visit_flow_stmt;
  local_f0.visit_jump_stmt = visit_jump_stmt;
  local_f0.visit_loop_stmt = visit_loop_stmt;
  local_f0.visit_empty_stmt = visit_empty_stmt;
  local_f0.visit_function_decl = visit_function_decl;
  local_f0.visit_variable_decl = visit_variable_decl;
  local_f0.visit_enum_decl = visit_enum_decl;
  local_f0.visit_class_decl = visit_class_decl;
  local_f0.visit_module_decl = visit_module_decl;
  local_f0.visit_binary_expr = visit_binary_expr;
  local_f0.visit_unary_expr = visit_unary_expr;
  local_f0.visit_file_expr = visit_file_expr;
  local_f0.visit_literal_expr = visit_literal_expr;
  local_f0.visit_identifier_expr = visit_identifier_expr;
  local_f0.visit_keyword_expr = visit_keyword_expr;
  local_f0.visit_list_expr = visit_list_expr;
  local_f0.visit_postfix_expr = visit_postfix_expr;
  local_f0.data = &local_118;
  local_f0.delegate = delegate;
  gvisit(&local_f0,node);
  if (pvStack_100 != (void *)0x0) {
    free(pvStack_100);
  }
  if (local_118->p != (gnode_t **)0x0) {
    free(local_118->p);
  }
  free(local_118);
  return local_f0.nerr == 0;
}

Assistant:

bool gravity_semacheck2 (gnode_t *node, gravity_delegate_t *delegate) {
    semacheck_t data = {.declarations = gnode_array_create(), .lasterror = 0};
    marray_init(data.statements);

    gvisitor_t visitor = {
        .nerr = 0,                            // used to store number of found errors
        .data = (void *)&data,                // used to store a pointer to the semantic check struct
        .delegate = (void *)delegate,        // compiler delegate to report errors

        // COMMON
        .visit_pre = NULL,
        .visit_post = NULL,

        // STATEMENTS: 7
        .visit_list_stmt = visit_list_stmt,
        .visit_compound_stmt = visit_compound_stmt,
        .visit_label_stmt = visit_label_stmt,
        .visit_flow_stmt = visit_flow_stmt,
        .visit_loop_stmt = visit_loop_stmt,
        .visit_jump_stmt = visit_jump_stmt,
        .visit_empty_stmt = visit_empty_stmt,

        // DECLARATIONS: 5
        .visit_function_decl = visit_function_decl,
        .visit_variable_decl = visit_variable_decl,
        .visit_enum_decl = visit_enum_decl,
        .visit_class_decl = visit_class_decl,
        .visit_module_decl = visit_module_decl,

        // EXPRESSIONS: 8
        .visit_binary_expr = visit_binary_expr,
        .visit_unary_expr = visit_unary_expr,
        .visit_file_expr = visit_file_expr,
        .visit_literal_expr = visit_literal_expr,
        .visit_identifier_expr = visit_identifier_expr,
        .visit_keyword_expr = visit_keyword_expr,
        .visit_list_expr = visit_list_expr,
        .visit_postfix_expr = visit_postfix_expr,
    };

    DEBUG_SEMA2("=== SEMANTIC CHECK STEP 2 ===");
    gvisit(&visitor, node);
    DEBUG_SEMA2("\n");

    marray_destroy(data.statements);
    gnode_array_free(data.declarations);
    return (visitor.nerr == 0);
}